

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O0

Abc_Cex_t * Cex_ManGenSimple(Cec_ManSat_t *p,int iOut)

{
  int nRealPis;
  Abc_Cex_t *pAVar1;
  Abc_Cex_t *pCex;
  int iOut_local;
  Cec_ManSat_t *p_local;
  
  nRealPis = Gia_ManCiNum(p->pAig);
  pAVar1 = Abc_CexAlloc(0,nRealPis,1);
  pAVar1->iPo = iOut;
  pAVar1->iFrame = 0;
  return pAVar1;
}

Assistant:

Abc_Cex_t * Cex_ManGenSimple( Cec_ManSat_t * p, int iOut )
{
    Abc_Cex_t * pCex;
    pCex = Abc_CexAlloc( 0, Gia_ManCiNum(p->pAig), 1 );
    pCex->iPo = iOut;
    pCex->iFrame = 0;
    return pCex;
}